

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O0

int lstrlenW(LPCWSTR lpString)

{
  int local_14;
  LPCWSTR pWStack_10;
  int nChar;
  LPCWSTR lpString_local;
  
  local_14 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pWStack_10 = lpString;
  if (lpString != (LPCWSTR)0x0) {
    while (*pWStack_10 != L'\0') {
      local_14 = local_14 + 1;
      pWStack_10 = pWStack_10 + 1;
    }
  }
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  return local_14;
}

Assistant:

int
PALAPI
lstrlenW(
	 IN LPCWSTR lpString)
{
    int nChar = 0;

    PERF_ENTRY(lstrlenW);
    ENTRY("lstrlenW (lpString=%p (%S))\n", lpString?lpString:W16_NULLSTRING, lpString?lpString:W16_NULLSTRING);
    if (lpString != NULL)
    {
        while (*lpString++)
        {
            nChar++;      
        }
    }
    LOGEXIT("lstrlenW returning int %d\n", nChar);
    PERF_EXIT(lstrlenW);
    return nChar;
}